

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linecontext.cpp
# Opt level: O0

void LineContext::testParseCpp(void)

{
  byte bVar1;
  QDebug *pQVar2;
  qint64 t;
  QMessageLogger local_a0;
  QDebug local_80;
  QString local_78;
  undefined1 local_60 [8];
  QElapsedTimer timer;
  LineContext context;
  undefined1 local_20 [8];
  QByteArray PARSE_CPP_FILE;
  
  qgetenv(local_20);
  bVar1 = QByteArray::isNull();
  if ((bVar1 & 1) == 0) {
    LineContext((LineContext *)&timer.t2);
    QElapsedTimer::QElapsedTimer((QElapsedTimer *)local_60);
    QElapsedTimer::start();
    QString::fromUtf8<void>(&local_78,(QByteArray *)local_20);
    init((LineContext *)&timer.t2,(EVP_PKEY_CTX *)&local_78);
    QString::~QString(&local_78);
    QMessageLogger::QMessageLogger(&local_a0,(char *)0x0,0,(char *)0x0);
    QMessageLogger::debug();
    pQVar2 = QDebug::operator<<(&local_80,"context.init cpp");
    t = QElapsedTimer::elapsed();
    pQVar2 = QDebug::operator<<(pQVar2,t);
    QDebug::operator<<(pQVar2,"ms");
    QDebug::~QDebug(&local_80);
    dump((LineContext *)&timer.t2);
    ~LineContext((LineContext *)&timer.t2);
  }
  QByteArray::~QByteArray((QByteArray *)local_20);
  return;
}

Assistant:

void LineContext::testParseCpp()
{
    auto PARSE_CPP_FILE = qgetenv("PARSE_CPP_FILE");
    if (PARSE_CPP_FILE.isNull()) {
        return;
    }
    LineContext context;
    QElapsedTimer timer;
    timer.start();
    context.init(QString::fromUtf8(PARSE_CPP_FILE));
    qDebug() << "context.init cpp" << timer.elapsed() << "ms";
    context.dump();
}